

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.cc
# Opt level: O0

undefined8 cnn::mp::ElapsedTimeString_abi_cxx11_(timespec *start,timespec *end)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  long *in_RDX;
  long *in_RSI;
  undefined8 in_RDI;
  long nsec;
  time_t secs;
  ostringstream ss;
  ostringstream local_190 [376];
  long *local_18;
  long *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  lVar1 = local_18[1];
  lVar2 = local_10[1];
  poVar3 = (ostream *)std::ostream::operator<<(local_190,*local_18 - *local_10);
  poVar3 = std::operator<<(poVar3," seconds and ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar1 - lVar2);
  std::operator<<(poVar3,"nseconds");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string ElapsedTimeString(const timespec& start, const timespec& end) {
      std::ostringstream ss;
      time_t secs = end.tv_sec - start.tv_sec;
      long nsec = end.tv_nsec - start.tv_nsec;
      ss << secs << " seconds and " << nsec << "nseconds";
      return ss.str();
    }